

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall tinyusdz::crate::CrateReader::ReadTOC(CrateReader *this)

{
  uint64_t uVar1;
  StreamReader *this_00;
  pointer pSVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  ulong uVar9;
  int64_t *piVar10;
  char *pcVar11;
  unsigned_long *in_R8;
  long lVar12;
  allocator local_221;
  uint64_t num_sections;
  string local_218;
  int64_t *local_1f8;
  int64_t *local_1f0;
  int64_t *local_1e8;
  int64_t *local_1e0;
  int64_t *local_1d8;
  int64_t *local_1d0;
  string local_1c8;
  ostringstream ss_e;
  
  uVar1 = this->_toc_offset;
  if (((long)uVar1 < 0x59) || (this_00 = this->_sr, (long)this_00->length_ <= (long)uVar1)) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReadTOC");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1873);
    ::std::operator<<(poVar8," ");
    pcVar11 = "Invalid toc offset.";
  }
  else {
    this_00->idx_ = uVar1;
    num_sections = 0;
    bVar6 = StreamReader::read8(this_00,&num_sections);
    if (bVar6) {
      if (num_sections < (this->_config).maxTOCSections) {
        ::std::vector<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>::resize
                  (&(this->_toc).sections,num_sections);
        uVar9 = num_sections * 0x20 + this->_memoryUsage;
        this->_memoryUsage = uVar9;
        if ((this->_config).maxMemoryBudget < uVar9) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar8 = ::std::operator<<(poVar8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar8 = ::std::operator<<(poVar8,"[Crate]");
          poVar8 = ::std::operator<<(poVar8,":");
          poVar8 = ::std::operator<<(poVar8,"ReadTOC");
          poVar8 = ::std::operator<<(poVar8,"():");
          poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x188a);
          ::std::operator<<(poVar8," ");
          pcVar11 = "Reached to max memory budget.";
          goto LAB_001975d1;
        }
        local_1f8 = &this->_paths_index;
        local_1f0 = &this->_specs_index;
        local_1e8 = &this->_fieldsets_index;
        local_1e0 = &this->_fields_index;
        local_1d8 = &this->_strings_index;
        local_1d0 = &this->_tokens_index;
        lVar12 = 0;
        uVar9 = 0;
        while( true ) {
          if (num_sections <= uVar9) {
            return true;
          }
          bVar6 = ReadSection(this,(Section *)
                                   (((this->_toc).sections.
                                     super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->name + lVar12));
          if (!bVar6) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTOC");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x188e);
            ::std::operator<<(poVar8," ");
            std::__cxx11::to_string(&local_1c8,uVar9);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_218,"Failed to read TOC section at ",&local_1c8);
            poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&local_218);
            ::std::operator<<(poVar8,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            goto LAB_0019761a;
          }
          pSVar2 = (this->_toc).sections.
                   super__Vector_base<tinyusdz::crate::Section,_std::allocator<tinyusdz::crate::Section>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar3 = *(ulong *)(pSVar2->name + lVar12 + 0x10);
          if ((long)uVar3 < 0) break;
          uVar4 = *(ulong *)(pSVar2->name + lVar12 + 0x18);
          if ((long)uVar4 < 1) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTOC");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x189a);
            ::std::operator<<(poVar8," ");
            pcVar11 = "Invalid or empty section size.";
            goto LAB_00197cde;
          }
          uVar5 = this->_sr->length_;
          if (uVar5 < uVar4) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTOC");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x189e);
            ::std::operator<<(poVar8," ");
            pcVar11 = "Section size exceeds input USDC data size.";
            goto LAB_00197cde;
          }
          if (uVar5 < uVar3) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTOC");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x18a2);
            ::std::operator<<(poVar8," ");
            pcVar11 = "Section start byte offset exceeds input USDC data size.";
            goto LAB_00197cde;
          }
          if (uVar5 < uVar4 + uVar3) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar8 = ::std::operator<<(poVar8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar8 = ::std::operator<<(poVar8,"[Crate]");
            poVar8 = ::std::operator<<(poVar8,":");
            poVar8 = ::std::operator<<(poVar8,"ReadTOC");
            poVar8 = ::std::operator<<(poVar8,"():");
            poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x18ad);
            ::std::operator<<(poVar8," ");
            pcVar11 = "Section byte offset + size exceeds input USDC data size.";
            goto LAB_00197cde;
          }
          pcVar11 = pSVar2->name + lVar12;
          iVar7 = strncmp(pcVar11,"TOKENS",0xf);
          piVar10 = local_1d0;
          if ((((iVar7 == 0) ||
               (iVar7 = strncmp(pcVar11,"STRINGS",0xf), piVar10 = local_1d8, iVar7 == 0)) ||
              (iVar7 = strncmp(pcVar11,"FIELDS",0xf), piVar10 = local_1e0, iVar7 == 0)) ||
             (((iVar7 = strncmp(pcVar11,"FIELDSETS",0xf), piVar10 = local_1e8, iVar7 == 0 ||
               (iVar7 = strncmp(pcVar11,"SPECS",0xf), piVar10 = local_1f0, iVar7 == 0)) ||
              (iVar7 = strncmp(pcVar11,"PATHS",0xf), piVar10 = local_1f8, iVar7 == 0)))) {
            *piVar10 = uVar9;
          }
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + 0x20;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,"[Crate]");
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReadTOC");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1896);
        ::std::operator<<(poVar8," ");
        pcVar11 = "Invalid section start byte offset.";
LAB_00197cde:
        ::std::__cxx11::string::string((string *)&local_1c8,pcVar11,&local_221);
        fmt::format(&local_218,(string *)&local_1c8);
        poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&local_218);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::_M_dispose();
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar8 = ::std::operator<<(poVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar8 = ::std::operator<<(poVar8,"[Crate]");
        poVar8 = ::std::operator<<(poVar8,":");
        poVar8 = ::std::operator<<(poVar8,"ReadTOC");
        poVar8 = ::std::operator<<(poVar8,"():");
        poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x1883);
        ::std::operator<<(poVar8," ");
        ::std::__cxx11::string::string
                  ((string *)&local_1c8,
                   "# of sections {} are too large. maxTOCSections is set to {}",&local_221);
        fmt::format<unsigned_long,unsigned_long>
                  (&local_218,(fmt *)&local_1c8,(string *)&num_sections,
                   &(this->_config).maxTOCSections,in_R8);
        poVar8 = ::std::operator<<((ostream *)&ss_e,(string *)&local_218);
        ::std::operator<<(poVar8,"\n");
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
      goto LAB_001975e8;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
    poVar8 = ::std::operator<<((ostream *)&ss_e,"[error]");
    poVar8 = ::std::operator<<(poVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar8 = ::std::operator<<(poVar8,":");
    poVar8 = ::std::operator<<(poVar8,"ReadTOC");
    poVar8 = ::std::operator<<(poVar8,"():");
    poVar8 = (ostream *)::std::ostream::operator<<(poVar8,0x187f);
    ::std::operator<<(poVar8," ");
    pcVar11 = "Failed to read TOC(# of sections).";
  }
LAB_001975d1:
  poVar8 = ::std::operator<<((ostream *)&ss_e,pcVar11);
  ::std::operator<<(poVar8,"\n");
LAB_001975e8:
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
LAB_0019761a:
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
  return false;
}

Assistant:

bool CrateReader::ReadTOC() {

  DCOUT(fmt::format("Memory budget: {} bytes", _config.maxMemoryBudget));

  if ((_toc_offset <= 88) || (_toc_offset >= int64_t(_sr->size()))) {
    PUSH_ERROR("Invalid toc offset.");
    return false;
  }

  if (!_sr->seek_set(uint64_t(_toc_offset))) {
    PUSH_ERROR("Failed to move to TOC offset.");
    return false;
  }

  // read # of sections.
  uint64_t num_sections{0};
  if (!_sr->read8(&num_sections)) {
    PUSH_ERROR("Failed to read TOC(# of sections).");
    return false;
  }
  if (num_sections >= _config.maxTOCSections) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of sections {} are too large. maxTOCSections is set to {}", num_sections, _config.maxTOCSections));
  }

  DCOUT("toc sections = " << num_sections);

  _toc.sections.resize(static_cast<size_t>(num_sections));

  CHECK_MEMORY_USAGE(num_sections * sizeof(Section));

  for (size_t i = 0; i < num_sections; i++) {
    if (!ReadSection(&_toc.sections[i])) {
      PUSH_ERROR("Failed to read TOC section at " + std::to_string(i));
      return false;
    }
    DCOUT("section[" << i << "] name = " << _toc.sections[i].name
                     << ", start = " << _toc.sections[i].start
                     << ", size = " << _toc.sections[i].size);

    if (_toc.sections[i].start < 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid section start byte offset."));
    }

    if (_toc.sections[i].size <= 0) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Invalid or empty section size."));
    }

    if (size_t(_toc.sections[i].size) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section size exceeds input USDC data size."));
    }

    if (size_t(_toc.sections[i].start) > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section start byte offset exceeds input USDC data size."));
    }

    // TODO: handle integer overflow.
    size_t end_offset = size_t(_toc.sections[i].start + _toc.sections[i].size);
    if (sizeof(void *) == 4) { // 32bit
      if (end_offset > size_t(std::numeric_limits<int32_t>::max())) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section end offset exceeds 32bit max."));
      }
    }
    if (end_offset > _sr->size()) {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Section byte offset + size exceeds input USDC data size."));
    }


    if (0 == strncmp(_toc.sections[i].name, "TOKENS",
                     crate::kSectionNameMaxLength)) {
      _tokens_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "STRINGS",
                            crate::kSectionNameMaxLength)) {
      _strings_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDS",
                            crate::kSectionNameMaxLength)) {
      _fields_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "FIELDSETS",
                            crate::kSectionNameMaxLength)) {
      _fieldsets_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "SPECS",
                            crate::kSectionNameMaxLength)) {
      _specs_index = int64_t(i);
    } else if (0 == strncmp(_toc.sections[i].name, "PATHS",
                            crate::kSectionNameMaxLength)) {
      _paths_index = int64_t(i);
    }
  }

  DCOUT("TOC read success");
  return true;
}